

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * __thiscall
testing::TestPartResult::ExtractSummary_abi_cxx11_
          (string *__return_storage_ptr__,TestPartResult *this,char *message)

{
  char *__beg;
  char *__end;
  allocator<char> local_35 [19];
  byte local_22;
  allocator<char> local_21;
  char *local_20;
  char *stack_trace;
  char *message_local;
  
  stack_trace = (char *)this;
  message_local = (char *)__return_storage_ptr__;
  __end = strstr((char *)this,"\nStack trace:\n");
  __beg = stack_trace;
  local_22 = 0;
  local_20 = __end;
  if (__end == (char *)0x0) {
    std::allocator<char>::allocator();
    local_22 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__beg,&local_21);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,__beg,__end,local_35);
    std::allocator<char>::~allocator(local_35);
  }
  if ((local_22 & 1) != 0) {
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestPartResult::ExtractSummary(const char* message) {
  const char* const stack_trace = strstr(message, internal::kStackTraceMarker);
  return stack_trace == NULL ? message :
      std::string(message, stack_trace);
}